

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcComplexProperty::IfcComplexProperty(IfcComplexProperty *this)

{
  IfcComplexProperty *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xa0,"IfcComplexProperty");
  IfcProperty::IfcProperty(&this->super_IfcProperty,&PTR_construction_vtable_24__00fe4da8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcComplexProperty,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcComplexProperty,_2UL> *)
             &(this->super_IfcProperty).field_0x58,&PTR_construction_vtable_24__00fe4dc8);
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0xfe4d40;
  *(undefined8 *)&this->field_0xa0 = 0xfe4d90;
  *(undefined8 *)&(this->super_IfcProperty).field_0x58 = 0xfe4d68;
  std::__cxx11::string::string((string *)&(this->super_IfcProperty).field_0x68);
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL>::ListOf
            (&this->HasProperties);
  return;
}

Assistant:

IfcComplexProperty() : Object("IfcComplexProperty") {}